

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_ModifySubscription
               (UA_Server *server,UA_Session *session,UA_ModifySubscriptionRequest *request,
               UA_ModifySubscriptionResponse *response)

{
  UA_UInt32 UVar1;
  UA_Subscription *subscription;
  long lVar2;
  
  subscription = UA_Session_getSubscriptionByID(session,request->subscriptionId);
  if (subscription == (UA_Subscription *)0x0) {
    UVar1 = 0x80280000;
    lVar2 = 0xc;
  }
  else {
    setSubscriptionSettings
              (server,subscription,request->requestedPublishingInterval,
               request->requestedLifetimeCount,request->requestedMaxKeepAliveCount,
               request->maxNotificationsPerPublish,request->priority);
    subscription->currentLifetimeCount = 0;
    response->revisedPublishingInterval = subscription->publishingInterval;
    response->revisedLifetimeCount = subscription->lifeTimeCount;
    UVar1 = subscription->maxKeepAliveCount;
    lVar2 = 0x94;
  }
  *(UA_UInt32 *)((long)&(response->responseHeader).timestamp + lVar2) = UVar1;
  return;
}

Assistant:

void
Service_ModifySubscription(UA_Server *server, UA_Session *session,
                           const UA_ModifySubscriptionRequest *request,
                           UA_ModifySubscriptionResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing ModifySubscriptionRequest");
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    setSubscriptionSettings(server, sub, request->requestedPublishingInterval,
                            request->requestedLifetimeCount, request->requestedMaxKeepAliveCount,
                            request->maxNotificationsPerPublish, request->priority);
    sub->currentLifetimeCount = 0; /* Reset the subscription lifetime */
    response->revisedPublishingInterval = sub->publishingInterval;
    response->revisedLifetimeCount = sub->lifeTimeCount;
    response->revisedMaxKeepAliveCount = sub->maxKeepAliveCount;
}